

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convTest.c
# Opt level: O1

void main(void)

{
  byte bVar1;
  int iVar2;
  long M;
  float *data;
  FILE *unaff_RBP;
  long lVar3;
  char *__s;
  ulong uVar4;
  float *data2;
  size_t sVar5;
  float *data1;
  long N;
  long lVar6;
  long lVar7;
  bool bVar8;
  long kernSize;
  long dataSize;
  long N2;
  float *local_70;
  long local_50;
  size_t local_48;
  long local_40 [2];
  
  local_40[1] = 2;
  local_50 = 0x3eb;
  local_40[0] = 0x416;
  printf(" %zu  Byte Floats \n",4);
  printf(" randseed = %10u\n",0x309);
  srand(0x309);
  M = lround(11.0);
  bVar1 = (byte)M;
  N = 1L << (bVar1 & 0x3f);
  printf("fft size = %6ld,  ",N);
  iVar2 = fftInit(M);
  uVar4 = (ulong)iVar2;
  sVar5 = 2L << (bVar1 & 0x3f);
  data = (float *)calloc(sVar5,4);
  if (data == (float *)0x0) {
    uVar4 = 2;
  }
  if (uVar4 == 0) {
    local_70 = (float *)calloc(sVar5,4);
    uVar4 = (ulong)((uint)(local_70 == (float *)0x0) * 2);
  }
  if (uVar4 == 0) {
    unaff_RBP = fopen("convdat.cnv","wb");
    uVar4 = 0xffffffffffffffce;
    if (unaff_RBP != (FILE *)0x0) {
      uVar4 = 0;
    }
  }
  if (uVar4 == 2) {
    __s = " out of memory ";
  }
  else {
    if (uVar4 == 0) {
      local_48 = sVar5;
      fwrite(local_40,8,1,unaff_RBP);
      fwrite(&local_50,8,1,unaff_RBP);
      fwrite(local_40 + 1,8,1,unaff_RBP);
      lVar6 = local_40[0];
      sVar5 = local_40[0] * 4;
      lVar7 = 0;
      do {
        if (0 < lVar6) {
          lVar3 = 0;
          do {
            iVar2 = rand();
            data[(lVar7 << (bVar1 & 0x3f)) + lVar3] = (float)iVar2 * 9.313226e-10 + -1.0;
            lVar3 = lVar3 + 1;
          } while (lVar6 != lVar3);
        }
        fwrite(data + (lVar7 << (bVar1 & 0x3f)),sVar5,1,unaff_RBP);
        bVar8 = lVar7 == 0;
        lVar7 = lVar7 + 1;
      } while (bVar8);
      lVar6 = 0;
      do {
        lVar7 = local_50;
        if (0 < local_50) {
          lVar3 = 0;
          do {
            iVar2 = rand();
            local_70[(lVar6 << (bVar1 & 0x3f)) + lVar3] = (float)iVar2 * 9.313226e-10 + -1.0;
            lVar3 = lVar3 + 1;
          } while (lVar7 != lVar3);
        }
        fwrite(local_70 + (lVar6 << (bVar1 & 0x3f)),lVar7 << 2,1,unaff_RBP);
        bVar8 = lVar6 == 0;
        lVar6 = lVar6 + 1;
      } while (bVar8);
      rffts(data,M,2);
      rffts(local_70,M,2);
      sVar5 = local_48;
      if (0 < (long)local_48) {
        lVar6 = 0;
        data2 = local_70;
        data1 = data;
        do {
          rspectprod(data1,data2,data1,N);
          lVar6 = lVar6 + N;
          data2 = data2 + N;
          data1 = data1 + N;
        } while (lVar6 < (long)sVar5);
      }
      riffts(data,M,2);
      fwrite(data,8L << (bVar1 & 0x3f),1,unaff_RBP);
      fclose(unaff_RBP);
      free(local_70);
      free(data);
      goto LAB_00101547;
    }
    __s = " error ";
  }
  puts(__s);
LAB_00101547:
  fftFree();
  puts(" Done. ");
  return;
}

Assistant:

void main(){
const long N2 = 2;		/* the number ffts to test */
long 	N = 2048;		/* size of FFTs, must be power of 2 */
long 	kernSize = 1003;	/* kernal size must be less than N */
long 	dataSize = N-kernSize+1;	/* data size */
float	*a;
float	*b;
long 	i1;
long 	i2;
long 	TheErr;
long		M;

FILE *fdataout;				/* output file */

unsigned int	randseed = 777;
int		rannum;
#if macintosh
	UnsignedWide 		TheTime1;
	Microseconds(&TheTime1);
	randseed = TheTime1.lo;
#endif

printf(" %zu  Byte Floats \n", sizeof(a[0]));
printf(" randseed = %10u\n", randseed);

srand(randseed);
M = lround(LOG2(N));
N = POW2(M);

printf("fft size = %6ld,  ",  N);

if (dataSize <= 0) TheErr = 22;
else TheErr = 0;

if(!TheErr){
	TheErr = fftInit(M);
}

a = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N
if (a == 0) TheErr = 2;
if(!TheErr){
	b = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N
	if (b == 0) TheErr = 2;
}
if(!TheErr){
	fdataout = fopen("convdat.cnv", "wb");
	if (fdataout == NULL) TheErr = -50;
}
if(!TheErr){

		/*  write sizes to fdataout */
	fwrite(&dataSize, sizeof(dataSize), 1, fdataout);
	fwrite(&kernSize, sizeof(kernSize), 1, fdataout);
	fwrite(&N2, sizeof(N2), 1, fdataout);
		/*  set up a simple test case and write to fdataout */
	for (i2=0; i2<N2; i2++){
		for (i1=0; i1<dataSize; i1++){
			rannum = rand();
			a[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&a[i2*N], dataSize*sizeof(float), 1, fdataout);
	}
	for (i2=0; i2<N2; i2++){
		for (i1=0; i1<kernSize; i1++){
			rannum = rand();
			b[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&b[i2*N], kernSize*sizeof(float), 1, fdataout);
	}


	/* fast convolution of zero padded sequences */
	rffts(a, M, N2);
	rffts(b, M, N2);
	for (i2=0; i2<N2*N; i2+=N){
		rspectprod(&a[i2], &b[i2], &a[i2], N);
	}
	riffts(a, M, N2);

	/* write out answer */
	fwrite(a, N2*N*sizeof(float), 1, fdataout);

	fclose(fdataout);

	free(b);
	free(a);
	fftFree();
}
else{
	if(TheErr==2)	printf(" out of memory \n");
	else	printf(" error \n");
	fftFree();
}
printf(" Done. \n");
return;
}